

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O2

void __thiscall MetricsDiscovery::MDHelper::PrintMetricNames(MDHelper *this,ostream *os)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  uint32_t i;
  uint uVar5;
  int iVar6;
  
  if ((((this->m_Initialized == true) && (this->m_ConcurrentGroup != (IConcurrentGroupLatest *)0x0))
      && (this->m_MetricSet != (IMetricSetLatest *)0x0)) &&
     (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) == 0)) {
    std::operator<<(os,"kernel,");
    uVar5 = 0;
    while( true ) {
      lVar2 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      if (*(uint *)(lVar2 + 0x20) <= uVar5) break;
      plVar3 = (long *)(**(code **)(*(long *)this->m_MetricSet + 0x18))(this->m_MetricSet,uVar5);
      lVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
      poVar4 = std::operator<<(os,*(char **)(lVar2 + 8));
      std::operator<<(poVar4,",");
      if (this->m_IncludeMaxValues == true) {
        poVar4 = std::operator<<(os,"max_");
        plVar3 = (long *)(**(code **)(*(long *)this->m_MetricSet + 0x18))(this->m_MetricSet,uVar5);
        lVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
        poVar4 = std::operator<<(poVar4,*(char **)(lVar2 + 8));
        std::operator<<(poVar4,",");
      }
      uVar5 = uVar5 + 1;
    }
    std::operator<<(os,",");
    uVar5 = 0;
    while( true ) {
      lVar2 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      if (*(uint *)(lVar2 + 0x24) <= uVar5) break;
      plVar3 = (long *)(**(code **)(*(long *)this->m_MetricSet + 0x20))(this->m_MetricSet,uVar5);
      lVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
      poVar4 = std::operator<<(os,*(char **)(lVar2 + 8));
      std::operator<<(poVar4,",");
      uVar5 = uVar5 + 1;
    }
    if ((this->m_APIMask & 1) != 0) {
      std::operator<<(os,",");
      lVar2 = (**(code **)(*(long *)this->m_ConcurrentGroup + 0x10))();
      iVar1 = *(int *)(lVar2 + 0x18);
      for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
        plVar3 = (long *)(**(code **)(*(long *)this->m_ConcurrentGroup + 0x40))
                                   (this->m_ConcurrentGroup,iVar6);
        lVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
        poVar4 = std::operator<<(os,*(char **)(lVar2 + 8));
        std::operator<<(poVar4,",");
      }
    }
    std::endl<char,std::char_traits<char>>(os);
    return;
  }
  return;
}

Assistant:

void MDHelper::PrintMetricNames( std::ostream& os )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet || !os.good() )
    {
        DebugPrint("Can't PrintMetricNames!\n");
        return;
    }

    os << "kernel,";

    for( uint32_t i = 0; i < m_MetricSet->GetParams()->MetricsCount; i++ )
    {
        os << m_MetricSet->GetMetric( i )->GetParams()->SymbolName << ",";
        if( m_IncludeMaxValues )
        {
            os << "max_" << m_MetricSet->GetMetric( i )->GetParams()->SymbolName << ",";
        }
    }

    os << ",";

    for(uint32_t i = 0; i < m_MetricSet->GetParams()->InformationCount; i++)
    {
        os << m_MetricSet->GetInformation( i )->GetParams()->SymbolName << ",";
    }

    if( m_APIMask & API_TYPE_IOSTREAM )
    {
        os << ",";

        const uint32_t ioInfoCount =
            m_ConcurrentGroup->GetParams()->IoMeasurementInformationCount;
        for( uint32_t i = 0; i < ioInfoCount; i++ )
        {
            os << m_ConcurrentGroup->GetIoMeasurementInformation( i )->GetParams()->SymbolName << ",";
        }
    }

    os << std::endl;
}